

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::internal::UnknownFieldSetSerializer
               (uint8 *base,uint32 offset,uint32 tag,uint32 has_offset,CodedOutputStream *output)

{
  uint8 *puVar1;
  
  if ((*(ulong *)(base + offset) & 1) != 0) {
    puVar1 = WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)(*(ulong *)(base + offset) & 0xfffffffffffffffe),
                        output->cur_,&output->impl_);
    output->cur_ = puVar1;
  }
  return;
}

Assistant:

void UnknownFieldSetSerializer(const uint8* base, uint32 offset, uint32 tag,
                               uint32 has_offset,
                               io::CodedOutputStream* output) {
  const void* ptr = base + offset;
  const InternalMetadataWithArena* metadata =
      static_cast<const InternalMetadataWithArena*>(ptr);
  if (metadata->have_unknown_fields()) {
    internal::WireFormat::SerializeUnknownFields(metadata->unknown_fields(),
                                                 output);
  }
}